

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

double __thiscall logging::log(logging *this,double __x)

{
  char in_AL;
  size_t sVar1;
  char *in_RDX;
  long lVar2;
  uint in_ESI;
  char *pcVar3;
  ostream *poVar4;
  ostream *poVar5;
  double dVar6;
  va_list ap;
  char text [1024];
  undefined8 local_4f8;
  void **local_4f0;
  undefined1 *local_4e8;
  undefined1 local_4d8 [48];
  double local_4a8;
  char local_428 [1024];
  
  if (in_AL != '\0') {
    local_4a8 = __x;
  }
  if (in_ESI == 3) {
    this->cntWarnings = this->cntWarnings + 1;
    if (3 < (int)this->minLevel) {
      return __x;
    }
  }
  else {
    if (in_ESI == 4) {
      this->cntErrors = this->cntErrors + 1;
    }
    if (4 < (int)in_ESI) {
      return __x;
    }
    if ((int)in_ESI < (int)this->minLevel) {
      return __x;
    }
  }
  if ((int)in_ESI < 1) {
    poVar5 = (ostream *)&std::cout;
  }
  else {
    poVar5 = (ostream *)&std::cerr;
  }
  memset(local_428,0,0x3ff);
  local_4e8 = local_4d8;
  local_4f0 = &ap[0].overflow_arg_area;
  local_4f8 = 0x3000000018;
  vsnprintf(local_428,0x3ff,in_RDX,&local_4f8);
  if (this->lastrelog == true) {
    this->lastrelog = false;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if (this->useColor == true) {
    switch(in_ESI) {
    case 0:
      poVar4 = (ostream *)&std::cout;
      pcVar3 = "\x1b[1;30m";
      break;
    default:
      goto switchD_00123bd4_caseD_1;
    case 2:
      poVar4 = (ostream *)&std::cerr;
      pcVar3 = "\x1b[1;32m";
      break;
    case 3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[1;33m",7);
      goto LAB_00123c0a;
    case 4:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[1;31m",7);
LAB_00123c47:
      poVar4 = (ostream *)&std::cerr;
      pcVar3 = "ERROR: ";
    }
    lVar2 = 7;
  }
  else {
    if (in_ESI != 3) {
      if (in_ESI != 4) goto switchD_00123bd4_caseD_1;
      goto LAB_00123c47;
    }
LAB_00123c0a:
    poVar4 = (ostream *)&std::cerr;
    pcVar3 = "WARNING: ";
    lVar2 = 9;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar2);
switchD_00123bd4_caseD_1:
  sVar1 = strlen(local_428);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_428,sVar1);
  if (((this->useColor == true) && (in_ESI < 5)) && (in_ESI != 1)) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0;m",5);
  }
  dVar6 = (double)std::ostream::flush();
  return dVar6;
}

Assistant:

void logging::log(loglevel level, const char* fmt, ... ) {

	// Save some statistics
	if(level == ERROR)
		cntErrors++;
	if(level == WARNING)
		cntWarnings++;


	// Check if level suffices...
	if( ! doPrint(level) )
		return;

	// Default output of log message
	std::ostream & os  = level >= INFO ? std::cerr : std::cout;

	char text[1024];
	memset(text, 0, sizeof(char)*1023);

	va_list ap;
	va_start(ap, fmt);
	vsnprintf(text, 1023, fmt, ap);
	va_end(ap);


	// Make a new line if last cmd was a relog command
	if(lastrelog)
	{
		lastrelog=false;
		os << std::endl;
	}

	// Switch color
	if( useColor )
	{
		switch( level )
		{
			case ERROR:
				os << "\033[1;31m";
				break;
			case WARNING:
				os << "\033[1;33m";
				break;
			case GOODNEWS:
				os << "\033[1;32m";
				break;
			case DEBUG:
				os << "\033[1;30m";
				break;
			default:
				break;
		}
	}


	switch( level )
	{
		case ERROR:
			os << "ERROR: ";
			break;
		case WARNING:
			os << "WARNING: ";
			break;
		default:
			break;
	}

	os << text;

	if( useColor ) {
		if( level==ERROR || level==WARNING || level==GOODNEWS || level==DEBUG )	
		os << "\033[0;m";
	}

	os.flush();
}